

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

short * __thiscall
Js::InterpreterStackFrame::WasmAtomicsArrayBoundsCheck<short>
          (InterpreterStackFrame *this,byte *buffer,uint64 index,uint32 byteLength)

{
  if (((ulong)(buffer + index) & 1) == 0) {
    WasmArrayBoundsCheck<short>(this,index,byteLength);
    return (short *)(buffer + index);
  }
  JavascriptError::ThrowWebAssemblyRuntimeError
            (*(ScriptContext **)(this + 0x78),-0x7ff5e489,(PCWSTR)0x0);
}

Assistant:

MemType* InterpreterStackFrame::WasmAtomicsArrayBoundsCheck(byte* buffer, uint64 index, uint32 byteLength)
    {
        MemType* readBuffer = (MemType*)(buffer + index);
        // Do alignment check to be coherent with the order the jit does the checks
        if (!::Math::IsAligned<intptr_t>((intptr_t)readBuffer, sizeof(MemType)))
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_UnalignedAtomicAccess);
        }
        WasmArrayBoundsCheck<MemType>(index, byteLength);
        return readBuffer;
    }